

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

void setNewCategoryWeights
               (int eigenCount,int rateCategoryCount,int instanceCount,
               vector<int,_std::allocator<int>_> *instances,double *weights)

{
  int iVar1;
  int i;
  ulong uVar2;
  uint uVar3;
  
  for (uVar3 = 0; uVar3 != (~(eigenCount >> 0x1f) & eigenCount); uVar3 = uVar3 + 1) {
    for (uVar2 = 0; (uint)(~(rateCategoryCount >> 0x1f) & rateCategoryCount) != uVar2;
        uVar2 = uVar2 + 1) {
      iVar1 = gt_rand();
      weights[uVar2] = (double)iVar1 / 2147483647.0;
    }
    for (uVar2 = 0; (uint)(~(instanceCount >> 0x1f) & instanceCount) != uVar2; uVar2 = uVar2 + 1) {
      beagleSetCategoryWeights
                ((instances->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar2],uVar3,weights);
    }
  }
  return;
}

Assistant:

void setNewCategoryWeights(int eigenCount,
                           int rateCategoryCount,
                           int instanceCount,
                           std::vector<int> instances,
#ifdef HAVE_PLL
                           bool pllTest,
                           bool pllOnly,
                           pll_partition_t* pll_partition,
#endif
                           double* weights)

{
    for (int eigenIndex=0; eigenIndex < eigenCount; eigenIndex++) {
        for (int i = 0; i < rateCategoryCount; i++) {
            weights[i] = gt_rand() / (double) GT_RAND_MAX;
        } 

        for(int inst=0; inst<instanceCount; inst++) {
#ifdef HAVE_PLL
            if (!pllOnly) {
#endif
            beagleSetCategoryWeights(instances[inst], eigenIndex, &weights[0]);
#ifdef HAVE_PLL
            } //if (!pllOnly) {
#endif
        }

#ifdef HAVE_PLL
        if (pllTest) {
            pll_set_category_weights(pll_partition, &weights[0]);
        }
#endif // HAVE_PLL

    }
}